

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Track::set_name(Track *this,char *name)

{
  size_t __n;
  char *pcVar1;
  size_t length;
  char *name_local;
  Track *this_local;
  
  if (name != (char *)0x0) {
    if (this->name_ != (char *)0x0) {
      operator_delete__(this->name_);
    }
    __n = strlen(name);
    pcVar1 = (char *)operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    this->name_ = pcVar1;
    if (this->name_ != (char *)0x0) {
      memcpy(this->name_,name,__n);
      this->name_[__n] = '\0';
    }
  }
  return;
}

Assistant:

void Track::set_name(const char* name) {
  if (name) {
    delete[] name_;

    const size_t length = strlen(name) + 1;
    name_ = new (std::nothrow) char[length];  // NOLINT
    if (name_) {
      memcpy(name_, name, length - 1);
      name_[length - 1] = '\0';
    }
  }
}